

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O0

void __thiscall
flatbuffers::python::PythonGenerator::StructBuilderArgs
          (PythonGenerator *this,StructDef *struct_def,string *nameprefix,string *namesuffix,
          bool has_field_name,string *fieldname_suffix,string *code_ptr)

{
  FieldDef *s;
  StructDef *struct_def_00;
  bool bVar1;
  reference ppFVar2;
  Value *type_00;
  string local_1c0;
  allocator<char> local_199;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  string *local_158;
  string *code;
  string local_130;
  string local_110;
  string local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  string local_a0 [8];
  string subprefix;
  Type *type;
  Type *field_type;
  FieldDef *field;
  __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
  local_40;
  const_iterator it;
  string *fieldname_suffix_local;
  bool has_field_name_local;
  string *namesuffix_local;
  string *nameprefix_local;
  StructDef *struct_def_local;
  PythonGenerator *this_local;
  
  it._M_current = (FieldDef **)fieldname_suffix;
  local_40._M_current =
       (FieldDef **)
       std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::begin
                 (&(struct_def->fields).vec);
  while( true ) {
    field = (FieldDef *)
            std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::end
                      (&(struct_def->fields).vec);
    bVar1 = __gnu_cxx::operator!=
                      (&local_40,
                       (__normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                        *)&field);
    if (!bVar1) break;
    ppFVar2 = __gnu_cxx::
              __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
              ::operator*(&local_40);
    s = *ppFVar2;
    type_00 = &s->value;
    bVar1 = IsArray(&type_00->type);
    if (bVar1) {
      Type::VectorType((Type *)((long)&subprefix.field_2 + 8),&type_00->type);
    }
    else {
      subprefix.field_2._8_4_ = (type_00->type).base_type;
      subprefix.field_2._12_4_ = (type_00->type).element;
    }
    bVar1 = IsStruct((Type *)((long)&subprefix.field_2 + 8));
    if (bVar1) {
      std::__cxx11::string::string(local_a0,(string *)nameprefix);
      if (has_field_name) {
        IdlNamer::Field_abi_cxx11_(&local_e0,&this->namer_,s);
        std::operator+(&local_c0,&local_e0,fieldname_suffix);
        std::__cxx11::string::operator+=(local_a0,(string *)&local_c0);
        std::__cxx11::string::~string((string *)&local_c0);
        std::__cxx11::string::~string((string *)&local_e0);
      }
      struct_def_00 = (s->value).type.struct_def;
      std::__cxx11::string::string((string *)&local_110,local_a0);
      std::__cxx11::string::string((string *)&local_130,(string *)namesuffix);
      std::__cxx11::string::string((string *)&code,(string *)fieldname_suffix);
      StructBuilderArgs(this,struct_def_00,&local_110,&local_130,has_field_name,(string *)&code,
                        code_ptr);
      std::__cxx11::string::~string((string *)&code);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string(local_a0);
    }
    else {
      local_158 = code_ptr;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_198,", ",&local_199);
      std::operator+(&local_178,&local_198,nameprefix);
      std::__cxx11::string::operator+=((string *)local_158,(string *)&local_178);
      std::__cxx11::string::~string((string *)&local_178);
      std::__cxx11::string::~string((string *)&local_198);
      std::allocator<char>::~allocator(&local_199);
      if (has_field_name) {
        IdlNamer::Field_abi_cxx11_(&local_1c0,&this->namer_,s);
        std::__cxx11::string::operator+=((string *)local_158,(string *)&local_1c0);
        std::__cxx11::string::~string((string *)&local_1c0);
      }
      std::__cxx11::string::operator+=((string *)local_158,(string *)namesuffix);
    }
    __gnu_cxx::
    __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
    ::operator++(&local_40);
  }
  return;
}

Assistant:

void StructBuilderArgs(const StructDef &struct_def,
                         const std::string nameprefix,
                         const std::string namesuffix, bool has_field_name,
                         const std::string fieldname_suffix,
                         std::string *code_ptr) const {
    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      auto &field = **it;
      const auto &field_type = field.value.type;
      const auto &type =
          IsArray(field_type) ? field_type.VectorType() : field_type;
      if (IsStruct(type)) {
        // Generate arguments for a struct inside a struct. To ensure names
        // don't clash, and to make it obvious these arguments are constructing
        // a nested struct, prefix the name with the field name.
        auto subprefix = nameprefix;
        if (has_field_name) {
          subprefix += namer_.Field(field) + fieldname_suffix;
        }
        StructBuilderArgs(*field.value.type.struct_def, subprefix, namesuffix,
                          has_field_name, fieldname_suffix, code_ptr);
      } else {
        auto &code = *code_ptr;
        code += std::string(", ") + nameprefix;
        if (has_field_name) { code += namer_.Field(field); }
        code += namesuffix;
      }
    }
  }